

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileParser::createObject(ObjFileParser *this,string *objName)

{
  Material *pMVar1;
  string *psVar2;
  bool bVar3;
  uint uVar4;
  Object *this_00;
  pointer pMVar5;
  pointer pMVar6;
  allocator<char> local_49;
  string local_48;
  string *local_18;
  string *objName_local;
  ObjFileParser *this_local;
  
  local_18 = objName;
  objName_local = (string *)this;
  bVar3 = std::operator!=((nullptr_t)0x0,&this->m_pModel);
  if (!bVar3) {
    __assert_fail("__null != m_pModel",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileParser.cpp"
                  ,0x32a,"void Assimp::ObjFileParser::createObject(const std::string &)");
  }
  this_00 = (Object *)operator_new(0x90);
  ObjFile::Object::Object(this_00);
  pMVar5 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  psVar2 = local_18;
  pMVar5->m_pCurrent = this_00;
  pMVar5 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  std::__cxx11::string::operator=((string *)pMVar5->m_pCurrent,(string *)psVar2);
  pMVar5 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  pMVar6 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::push_back
            (&pMVar5->m_Objects,&pMVar6->m_pCurrent);
  createMesh(this,local_18);
  pMVar5 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
           operator->(&this->m_pModel);
  if (pMVar5->m_pCurrentMaterial != (Material *)0x0) {
    pMVar5 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    pMVar1 = pMVar5->m_pCurrentMaterial;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,(pMVar1->MaterialName).data,&local_49);
    uVar4 = getMaterialIndex(this,&local_48);
    pMVar5 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    pMVar5->m_pCurrentMesh->m_uiMaterialIndex = uVar4;
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    pMVar5 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    pMVar1 = pMVar5->m_pCurrentMaterial;
    pMVar5 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    pMVar5->m_pCurrentMesh->m_pMaterial = pMVar1;
  }
  return;
}

Assistant:

void ObjFileParser::createObject(const std::string &objName)
{
    ai_assert( NULL != m_pModel );

    m_pModel->m_pCurrent = new ObjFile::Object;
    m_pModel->m_pCurrent->m_strObjName = objName;
    m_pModel->m_Objects.push_back( m_pModel->m_pCurrent );

    createMesh( objName  );

    if( m_pModel->m_pCurrentMaterial )
    {
        m_pModel->m_pCurrentMesh->m_uiMaterialIndex =
            getMaterialIndex( m_pModel->m_pCurrentMaterial->MaterialName.data );
        m_pModel->m_pCurrentMesh->m_pMaterial = m_pModel->m_pCurrentMaterial;
    }
}